

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O0

void __thiscall testing::internal::ExpectationBase::RetireAllPreRequisites(ExpectationBase *this)

{
  bool bVar1;
  reference ppEVar2;
  pointer this_00;
  __shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2> *this_01;
  ExpectationBase *local_68;
  ExpectationBase *next;
  _Self local_58;
  const_iterator it;
  ExpectationBase *exp;
  allocator<testing::internal::ExpectationBase_*> local_31;
  ExpectationBase *local_30;
  undefined1 local_28 [8];
  vector<testing::internal::ExpectationBase_*,_std::allocator<testing::internal::ExpectationBase_*>_>
  expectations;
  ExpectationBase *this_local;
  
  expectations.
  super__Vector_base<testing::internal::ExpectationBase_*,_std::allocator<testing::internal::ExpectationBase_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  bVar1 = is_retired(this);
  if (!bVar1) {
    local_30 = this;
    std::allocator<testing::internal::ExpectationBase_*>::allocator(&local_31);
    std::
    vector<testing::internal::ExpectationBase_*,_std::allocator<testing::internal::ExpectationBase_*>_>
    ::vector((vector<testing::internal::ExpectationBase_*,_std::allocator<testing::internal::ExpectationBase_*>_>
              *)local_28,1,&local_30,&local_31);
    std::allocator<testing::internal::ExpectationBase_*>::~allocator(&local_31);
    while (bVar1 = std::
                   vector<testing::internal::ExpectationBase_*,_std::allocator<testing::internal::ExpectationBase_*>_>
                   ::empty((vector<testing::internal::ExpectationBase_*,_std::allocator<testing::internal::ExpectationBase_*>_>
                            *)local_28), ((bVar1 ^ 0xffU) & 1) != 0) {
      ppEVar2 = std::
                vector<testing::internal::ExpectationBase_*,_std::allocator<testing::internal::ExpectationBase_*>_>
                ::back((vector<testing::internal::ExpectationBase_*,_std::allocator<testing::internal::ExpectationBase_*>_>
                        *)local_28);
      it._M_node = (_Base_ptr)*ppEVar2;
      std::
      vector<testing::internal::ExpectationBase_*,_std::allocator<testing::internal::ExpectationBase_*>_>
      ::pop_back((vector<testing::internal::ExpectationBase_*,_std::allocator<testing::internal::ExpectationBase_*>_>
                  *)local_28);
      local_58._M_node = (_Base_ptr)ExpectationSet::begin((ExpectationSet *)&it._M_node[3]._M_left);
      while( true ) {
        next = (ExpectationBase *)ExpectationSet::end((ExpectationSet *)&it._M_node[3]._M_left);
        bVar1 = std::operator!=(&local_58,(_Self *)&next);
        if (!bVar1) break;
        this_00 = std::_Rb_tree_const_iterator<testing::Expectation>::operator->(&local_58);
        this_01 = &Expectation::expectation_base(this_00)->
                   super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>
        ;
        local_68 = std::__shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>
                   ::get(this_01);
        bVar1 = is_retired(local_68);
        if (!bVar1) {
          Retire(local_68);
          std::
          vector<testing::internal::ExpectationBase_*,_std::allocator<testing::internal::ExpectationBase_*>_>
          ::push_back((vector<testing::internal::ExpectationBase_*,_std::allocator<testing::internal::ExpectationBase_*>_>
                       *)local_28,&local_68);
        }
        std::_Rb_tree_const_iterator<testing::Expectation>::operator++(&local_58);
      }
    }
    std::
    vector<testing::internal::ExpectationBase_*,_std::allocator<testing::internal::ExpectationBase_*>_>
    ::~vector((vector<testing::internal::ExpectationBase_*,_std::allocator<testing::internal::ExpectationBase_*>_>
               *)local_28);
  }
  return;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
  if (is_retired()) {
    // We can take this short-cut as we never retire an expectation
    // until we have retired all its pre-requisites.
    return;
  }

  ::std::vector<ExpectationBase*> expectations(1, this);
  while (!expectations.empty()) {
    ExpectationBase* exp = expectations.back();
    expectations.pop_back();

    for (ExpectationSet::const_iterator it =
             exp->immediate_prerequisites_.begin();
         it != exp->immediate_prerequisites_.end(); ++it) {
      ExpectationBase* next = it->expectation_base().get();
      if (!next->is_retired()) {
        next->Retire();
        expectations.push_back(next);
      }
    }
  }
}